

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O0

CoverageBinSymbol *
slang::ast::CoverageBinSymbol::fromSyntax(Scope *scope,BinsSelectionSyntax *syntax)

{
  CoverageBinSymbol *this;
  BinsSelectionSyntax *scope_00;
  Compilation *this_00;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  SourceLocation local_40;
  string_view local_38;
  CoverageBinSymbol *local_28;
  CoverageBinSymbol *result;
  Compilation *comp;
  BinsSelectionSyntax *syntax_local;
  Scope *scope_local;
  
  comp = (Compilation *)syntax;
  syntax_local = (BinsSelectionSyntax *)scope;
  this_00 = Scope::getCompilation(scope);
  result = (CoverageBinSymbol *)this_00;
  local_38 = parsing::Token::valueText
                       ((Token *)&(comp->options).topModules.
                                  super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                                  .hash_policy);
  local_40 = parsing::Token::location
                       ((Token *)&(comp->options).topModules.
                                  super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                                  .hash_policy);
  local_28 = BumpAllocator::
             emplace<slang::ast::CoverageBinSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                       (&this_00->super_BumpAllocator,&local_38,&local_40);
  Symbol::setSyntax(&local_28->super_Symbol,(SyntaxNode *)comp);
  scope_00 = syntax_local;
  this = local_28;
  syntax_00 = slang::syntax::SyntaxList::operator_cast_to_span((SyntaxList *)&comp->options);
  Symbol::setAttributes(&this->super_Symbol,(Scope *)scope_00,syntax_00);
  if (*(short *)&(comp->options).topModules.
                 super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                 .entries == 0xba) {
    local_28->binsKind = IgnoreBins;
  }
  else if (*(short *)&(comp->options).topModules.
                      super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                      .entries == 0xbb) {
    local_28->binsKind = IllegalBins;
  }
  return local_28;
}

Assistant:

CoverageBinSymbol& CoverageBinSymbol::fromSyntax(const Scope& scope,
                                                 const BinsSelectionSyntax& syntax) {
    auto& comp = scope.getCompilation();
    auto result = comp.emplace<CoverageBinSymbol>(syntax.name.valueText(), syntax.name.location());
    result->setSyntax(syntax);
    result->setAttributes(scope, syntax.attributes);

    if (syntax.keyword.kind == TokenKind::IgnoreBinsKeyword)
        result->binsKind = IgnoreBins;
    else if (syntax.keyword.kind == TokenKind::IllegalBinsKeyword)
        result->binsKind = IllegalBins;

    return *result;
}